

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  int iVar1;
  significand_type *psVar2;
  long lVar3;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar4;
  appender aVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  char cVar12;
  ulong uVar13;
  sign_t sVar14;
  int iVar15;
  uint uVar16;
  float_specs fVar17;
  int iVar18;
  uint uVar19;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_e7 [3];
  bool local_e4 [16];
  int local_d4;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0;
  void *local_98;
  basic_format_specs<char> *local_90;
  float_specs local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  psVar2 = (significand_type *)f->significand;
  lVar3 = 0x3f;
  if (((ulong)psVar2 | 1) != 0) {
    for (; ((ulong)psVar2 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  iVar18 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
           (uint)(psVar2 < *(significand_type **)
                            (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                            (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] * 8));
  local_e7[2] = '0';
  sVar14 = fspecs._5_1_;
  local_e7[1] = sVar14;
  local_d4 = iVar18;
  local_d0._0_8_ = psVar2;
  local_80 = (undefined1  [8])fspecs;
  if (iVar18 < 0) {
LAB_0022fc5e:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/core.h"
                ,0x199,"negative value");
  }
  uVar13 = (ulong)((iVar18 + 1) - (uint)(sVar14 == none));
  local_e7[0] = '.';
  uVar9 = fspecs._4_4_;
  fVar17 = fspecs;
  if ((uVar9 >> 0x11 & 1) != 0) {
    local_e4._4_8_ = uVar13;
    local_98 = loc.locale_;
    local_90 = specs;
    local_88 = fspecs;
    local_e7[0] = decimal_point_impl<char>(loc);
    specs = local_90;
    loc.locale_ = local_98;
    uVar13 = local_e4._4_8_;
    fVar17 = local_88;
  }
  iVar8 = f->exponent;
  iVar1 = iVar18 + iVar8;
  iVar15 = fVar17.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0022f9a3:
    iVar8 = iVar18 + iVar8 + -1;
    if ((uVar9 >> 0x13 & 1) == 0) {
      iVar10 = 0;
      if (iVar18 == 1) {
        local_e7[0] = '\0';
        iVar10 = 0;
      }
    }
    else {
      iVar10 = 0;
      if (0 < iVar15 - iVar18) {
        iVar10 = iVar15 - iVar18;
      }
      uVar13 = (ulong)(uint)((int)uVar13 + iVar10);
    }
    local_78[0] = sVar14;
    local_78[0x14] = local_e7[0];
    local_78._16_4_ = iVar18;
    local_60._0_5_ = CONCAT14('0',iVar10);
    local_60 = (decimal_fp<double> *)
               (CONCAT26(local_60._6_2_,
                         CONCAT15(((uVar9 >> 0x10 & 1) == 0) << 5,(undefined5)local_60)) |
               0x450000000000);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_58._4_4_,iVar8);
    local_78._8_8_ = psVar2;
    if (0 < specs->width) {
      if (iVar1 < 1) {
        iVar8 = 1 - iVar1;
      }
      lVar3 = 2;
      if (99 < iVar8) {
        lVar3 = (ulong)(999 < iVar8) + 3;
      }
      sVar6 = uVar13 + (3 - (ulong)(local_e7[0] == '\0')) + lVar3;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,sVar6,sVar6,(anon_class_40_8_dbbf3351 *)local_78);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    aVar5 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<double>,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()
                      ((anon_class_40_8_dbbf3351 *)local_78,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar10 = 0x10;
    if (0 < iVar15) {
      iVar10 = iVar15;
    }
    if ((iVar1 < -3) || (iVar10 < iVar1)) goto LAB_0022f9a3;
  }
  local_d0._12_4_ = iVar1;
  if (iVar8 < 0) {
    if (iVar1 < 1) {
      iVar8 = -iVar1;
      local_c0._M_allocated_capacity._0_4_ = iVar8;
      if (SBORROW4(iVar15,iVar8) != iVar15 + iVar1 < 0) {
        local_c0._M_allocated_capacity._0_4_ = iVar15;
      }
      if (iVar15 < 0) {
        local_c0._M_allocated_capacity._0_4_ = iVar8;
      }
      if (iVar18 != 0) {
        local_c0._M_allocated_capacity._0_4_ = iVar8;
      }
      if (iVar18 == 0 && local_c0._M_allocated_capacity._0_4_ == 0) {
        local_e4[0] = (bool)(char)((uVar9 & 0x80000) >> 0x13);
        iVar18 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_e4[0] = true;
        iVar18 = 2;
        if ((int)local_c0._M_allocated_capacity._0_4_ < 0) goto LAB_0022fc5e;
      }
      sVar6 = (uint)(iVar18 + local_c0._M_allocated_capacity._0_4_) + uVar13;
      local_78._0_8_ = local_e7 + 1;
      local_78._8_8_ = local_e7 + 2;
      local_78._16_8_ = local_e7 + 3;
      local_60 = (decimal_fp<double> *)local_e7;
      local_58 = &local_c0;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0;
      local_48 = &local_d4;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        (out,specs,sVar6,sVar6,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    uVar19 = 0;
    local_e4._0_4_ = iVar15 - iVar18 & (int)(uVar9 << 0xc) >> 0x1f;
    uVar16 = local_e4._0_4_;
    if ((int)local_e4._0_4_ < 1) {
      uVar16 = uVar19;
    }
    local_e4._4_8_ = uVar13;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&local_c0,loc,(bool)((byte)(uVar9 >> 0x11) & 1));
    if (local_a0 != '\0') {
      pcVar11 = (char *)CONCAT44(local_c0._M_allocated_capacity._4_4_,
                                 local_c0._M_allocated_capacity._0_4_);
      pcVar7 = pcVar11 + local_c0._8_8_;
      lVar3 = 0;
      do {
        if (pcVar11 == pcVar7) {
          cVar12 = pcVar7[-1];
          pcVar11 = pcVar7;
        }
        else {
          cVar12 = *pcVar11;
          if ((byte)(cVar12 + 0x81U) < 0x82) goto LAB_0022fc7b;
          pcVar11 = pcVar11 + 1;
        }
        uVar19 = uVar19 + (int)cVar12;
        if (local_d4 <= (int)uVar19) goto LAB_0022fc7b;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_0022fc7b:
    sVar6 = (ulong)uVar16 + local_e4._4_8_ + lVar3 + 1;
    local_78._0_8_ = local_e7 + 1;
    local_78._8_8_ = local_d0;
    local_78._16_8_ = &local_d4;
    local_60 = (decimal_fp<double> *)(local_d0 + 0xc);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e7;
    local_48 = (int *)(local_e7 + 3);
    local_40 = (int *)(local_e7 + 2);
    local_50 = &local_c0;
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   (out,specs,sVar6,sVar6,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_0022fcde;
  }
  local_e4._4_8_ = ZEXT48((uint)(iVar8 + (int)uVar13));
  local_e4._0_4_ = iVar15 - iVar1;
  if ((uVar9 >> 0x13 & 1) != 0) {
    local_e4._4_8_ = local_e4._4_8_ + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e4._0_4_) {
      if ((int)local_e4._0_4_ < 1) goto LAB_0022fb5c;
    }
    else {
      local_e4[0] = true;
      local_e4[1] = false;
      local_e4[2] = false;
      local_e4[3] = false;
    }
    local_e4._4_8_ = local_e4._4_8_ + (ulong)(uint)local_e4._0_4_;
  }
LAB_0022fb5c:
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)&local_c0,loc,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar18 = 0;
  if (local_a0 != '\0') {
    pcVar11 = (char *)CONCAT44(local_c0._M_allocated_capacity._4_4_,
                               local_c0._M_allocated_capacity._0_4_);
    pcVar7 = pcVar11 + local_c0._8_8_;
    lVar3 = 0;
    do {
      if (pcVar11 == pcVar7) {
        cVar12 = pcVar7[-1];
        pcVar11 = pcVar7;
      }
      else {
        cVar12 = *pcVar11;
        if ((byte)(cVar12 + 0x81U) < 0x82) goto LAB_0022fbc8;
        pcVar11 = pcVar11 + 1;
      }
      iVar18 = iVar18 + cVar12;
      if (iVar1 <= iVar18) goto LAB_0022fbc8;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_0022fbc8:
  local_78._0_8_ = local_e7 + 1;
  local_78._8_8_ = local_d0;
  local_78._16_8_ = &local_d4;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80;
  local_48 = (int *)local_e7;
  local_40 = (int *)(local_e7 + 3);
  local_38 = local_e7 + 2;
  local_60 = f;
  local_58 = &local_c0;
  bVar4.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 (out,specs,local_e4._4_8_ + lVar3,local_e4._4_8_ + lVar3,
                  (anon_class_72_9_0c6a3a8a *)local_78);
LAB_0022fcde:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_c0._M_allocated_capacity._4_4_,local_c0._M_allocated_capacity._0_4_) !=
      &local_b0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_c0._M_allocated_capacity._4_4_,
                                local_c0._M_allocated_capacity._0_4_),
                    local_b0._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}